

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmCPackIFWGenerator::BuildBinaryCreatorCommmand_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmCPackIFWGenerator *this)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  _func_int **pp_Var5;
  cmCPackLog *this_00;
  long lVar6;
  _Alloc_hider msg;
  bool bVar7;
  long *plVar8;
  size_t length;
  _Rb_tree_node_base *p_Var9;
  _Base_ptr p_Var10;
  size_type *psVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  cmCPackIFWGenerator *this_01;
  iterator __begin2;
  string ifwArg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  cmCPackIFWGenerator *local_1d0;
  undefined1 local_1c8 [112];
  ios_base local_158 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  local_1f0._M_string_length = 0;
  local_1f0.field_2._M_local_buf[0] = '\0';
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&this->BinCreator);
  this_01 = (cmCPackIFWGenerator *)&this->super_cmCPackIFWCommon;
  bVar7 = cmCPackIFWCommon::IsVersionLess((cmCPackIFWCommon *)this_01,"4.2");
  if (!bVar7) {
    if ((this->ArchiveFormat)._M_string_length != 0) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[17]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,(char (*) [17])"--archive-format");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&this->ArchiveFormat);
    }
    if ((this->ArchiveCompression)._M_string_length != 0) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[14]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,(char (*) [14])"--compression");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&this->ArchiveCompression);
    }
  }
  cmCPackIFWCommon::IsVersionLess((cmCPackIFWCommon *)this_01,"3.0");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,(char (*) [3])0x7374ff);
  local_1c8._0_8_ = local_1c8 + 0x10;
  pcVar3 = (this->super_cmCPackGenerator).toplevel._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c8,pcVar3,
             pcVar3 + (this->super_cmCPackGenerator).toplevel._M_string_length);
  std::__cxx11::string::append(local_1c8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8);
  if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  if ((this->Installer).Resources.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->Installer).Resources.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,(char (*) [3])"-r");
    pbVar12 = (this->Installer).Resources.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_1c8._0_8_ = local_1c8 + 0x10;
    pcVar3 = (this->super_cmCPackGenerator).toplevel._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1c8,pcVar3,
               pcVar3 + (this->super_cmCPackGenerator).toplevel._M_string_length);
    std::__cxx11::string::append(local_1c8);
    std::operator+(&local_210,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                   pbVar12);
    local_1d0 = this_01;
    std::__cxx11::string::operator=((string *)&local_1f0,(string *)&local_210);
    paVar2 = &local_210.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    pbVar12 = pbVar12 + 1;
    if (pbVar12 !=
        (this->Installer).Resources.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::operator+(&local_50,",",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c8);
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_50,(ulong)(pbVar12->_M_dataplus)._M_p);
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_210.field_2._M_allocated_capacity = *psVar11;
          local_210.field_2._8_8_ = plVar8[3];
          local_210._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_210.field_2._M_allocated_capacity = *psVar11;
          local_210._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_210._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_210._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != paVar2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        pbVar12 = pbVar12 + 1;
      } while (pbVar12 !=
               (this->Installer).Resources.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_1f0);
    this_01 = local_1d0;
    if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
      this_01 = local_1d0;
    }
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,(char (*) [3])"-p");
  local_1c8._0_8_ = local_1c8 + 0x10;
  pcVar3 = (this->super_cmCPackGenerator).toplevel._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c8,pcVar3,
             pcVar3 + (this->super_cmCPackGenerator).toplevel._M_string_length);
  std::__cxx11::string::append(local_1c8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8);
  if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  pbVar4 = (this->PkgsDirsVector).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar12 = (this->PkgsDirsVector).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar4; pbVar12 = pbVar12 + 1
      ) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,(char (*) [3])"-p");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,pbVar12);
  }
  if ((this->RepoDirsVector).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->RepoDirsVector).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar7 = cmCPackIFWCommon::IsVersionLess((cmCPackIFWCommon *)this_01,"3.1");
    if (bVar7) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,"The \"CPACK_IFW_REPOSITORIES_DIRECTORIES\" ",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,"variable is set, but content will be skipped, ",0x2e);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,"because this feature available only since ",0x2a);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,"QtIFW 3.1. Please update your QtIFW instance.",0x2d);
      std::ios::widen((char)(ostream *)local_1c8 + (char)*(undefined8 *)(local_1c8._0_8_ + -0x18));
      std::ostream::put((char)local_1c8);
      std::ostream::flush();
      pp_Var5 = (this_01->super_cmCPackGenerator)._vptr_cmCPackGenerator;
      if (pp_Var5 != (_func_int **)0x0) {
        this_00 = (cmCPackLog *)pp_Var5[0x2a];
        std::__cxx11::stringbuf::str();
        msg._M_p = local_210._M_dataplus._M_p;
        length = strlen(local_210._M_dataplus._M_p);
        cmCPackLog::Log(this_00,8,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                        ,0xe7,msg._M_p,length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
      std::ios_base::~ios_base(local_158);
    }
    else {
      pbVar4 = (this->RepoDirsVector).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar12 = (this->RepoDirsVector).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar4;
          pbVar12 = pbVar12 + 1) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[13]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,(char (*) [13])"--repository");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,pbVar12);
      }
    }
  }
  if (this->OnlineOnly == true) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[14]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,(char (*) [14])"--online-only");
  }
  else if (((this->DownloadedPackages)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
          ((this->Installer).RemoteRepositories.
           super__Vector_base<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>.
           _M_impl.super__Vector_impl_data._M_start ==
           (this->Installer).RemoteRepositories.
           super__Vector_base<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>.
           _M_impl.super__Vector_impl_data._M_finish)) {
    if ((this->DependentPackages)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[3]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,(char (*) [3])"-i");
      local_1f0._M_string_length = 0;
      *local_1f0._M_dataplus._M_p = '\0';
      p_Var10 = (this->BinaryPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var1 = &(this->BinaryPackages)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var10 != p_Var1) {
        do {
          local_1c8._0_8_ = local_1c8 + 0x10;
          lVar6 = *(long *)(*(long *)(p_Var10 + 1) + 0xa8);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1c8,lVar6,*(long *)(*(long *)(p_Var10 + 1) + 0xb0) + lVar6);
          std::__cxx11::string::append((char *)local_1c8);
          std::__cxx11::string::_M_append((char *)&local_1f0,local_1c8._0_8_);
          if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
            operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
          }
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
        } while ((_Rb_tree_header *)p_Var10 != p_Var1);
      }
      p_Var9 = (this->DependentPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::__cxx11::string::_M_append((char *)&local_1f0,*(ulong *)(p_Var9 + 2));
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
      p_Var1 = &(this->DependentPackages)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var9 != p_Var1) {
        do {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1c8,",",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var9 + 2));
          std::__cxx11::string::_M_append((char *)&local_1f0,local_1c8._0_8_);
          if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
            operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
          }
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
        } while ((_Rb_tree_header *)p_Var9 != p_Var1);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_1f0);
    }
  }
  else {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,(char (*) [3])"-e");
    p_Var9 = (this->DownloadedPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::_M_assign((string *)&local_1f0);
    p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
    p_Var1 = &(this->DownloadedPackages)._M_t._M_impl.super__Rb_tree_header;
    local_1d0 = this;
    if ((_Rb_tree_header *)p_Var9 != p_Var1) {
      do {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c8,",",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)(p_Var9 + 1) + 0xa8));
        std::__cxx11::string::_M_append((char *)&local_1f0,local_1c8._0_8_);
        if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
          operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
        }
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
      } while ((_Rb_tree_header *)p_Var9 != p_Var1);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_1f0);
    this = local_1d0;
  }
  pbVar12 = (this->super_cmCPackGenerator).packageFileNames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar12 ==
      (this->super_cmCPackGenerator).packageFileNames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                   "installer",&this->OutputExtension);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8);
    if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
  }
  else {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,pbVar12);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,
                    CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                             local_1f0.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmCPackIFWGenerator::BuildBinaryCreatorCommmand()
{
  std::vector<std::string> ifwCmd;
  std::string ifwArg;

  ifwCmd.emplace_back(this->BinCreator);

  if (!this->IsVersionLess("4.2")) {
    if (!this->ArchiveFormat.empty()) {
      ifwCmd.emplace_back("--archive-format");
      ifwCmd.emplace_back(this->ArchiveFormat);
    }
    if (!this->ArchiveCompression.empty()) {
      ifwCmd.emplace_back("--compression");
      ifwCmd.emplace_back(this->ArchiveCompression);
    }
  }

  if (!this->IsVersionLess("3.0")) {
#ifdef __APPLE__
    // macOS only
    std::string signingIdentity = this->Installer.SigningIdentity;
    if (!signingIdentity.empty()) {
      ifwCmd.emplace_back("--sign");
      ifwCmd.emplace_back(signingIdentity);
    }
#endif
  }

  ifwCmd.emplace_back("-c");
  ifwCmd.emplace_back(this->toplevel + "/config/config.xml");

  if (!this->Installer.Resources.empty()) {
    ifwCmd.emplace_back("-r");
    auto it = this->Installer.Resources.begin();
    std::string path = this->toplevel + "/resources/";
    ifwArg = path + *it;
    ++it;
    while (it != this->Installer.Resources.end()) {
      ifwArg += "," + path + *it;
      ++it;
    }
    ifwCmd.emplace_back(ifwArg);
  }

  ifwCmd.emplace_back("-p");
  ifwCmd.emplace_back(this->toplevel + "/packages");

  if (!this->PkgsDirsVector.empty()) {
    for (std::string const& it : this->PkgsDirsVector) {
      ifwCmd.emplace_back("-p");
      ifwCmd.emplace_back(it);
    }
  }

  if (!this->RepoDirsVector.empty()) {
    if (!this->IsVersionLess("3.1")) {
      for (std::string const& rd : this->RepoDirsVector) {
        ifwCmd.emplace_back("--repository");
        ifwCmd.emplace_back(rd);
      }
    } else {
      cmCPackIFWLogger(WARNING,
                       "The \"CPACK_IFW_REPOSITORIES_DIRECTORIES\" "
                         << "variable is set, but content will be skipped, "
                         << "because this feature available only since "
                         << "QtIFW 3.1. Please update your QtIFW instance."
                         << std::endl);
    }
  }

  if (this->OnlineOnly) {
    ifwCmd.emplace_back("--online-only");
  } else if (!this->DownloadedPackages.empty() &&
             !this->Installer.RemoteRepositories.empty()) {
    ifwCmd.emplace_back("-e");
    auto it = this->DownloadedPackages.begin();
    ifwArg = (*it)->Name;
    ++it;
    while (it != this->DownloadedPackages.end()) {
      ifwArg += "," + (*it)->Name;
      ++it;
    }
    ifwCmd.emplace_back(ifwArg);
  } else if (!this->DependentPackages.empty()) {
    ifwCmd.emplace_back("-i");
    ifwArg.clear();
    // Binary
    auto bit = this->BinaryPackages.begin();
    while (bit != this->BinaryPackages.end()) {
      ifwArg += (*bit)->Name + ",";
      ++bit;
    }
    // Depend
    auto it = this->DependentPackages.begin();
    ifwArg += it->second.Name;
    ++it;
    while (it != this->DependentPackages.end()) {
      ifwArg += "," + it->second.Name;
      ++it;
    }
    ifwCmd.emplace_back(ifwArg);
  }
  // TODO: set correct name for multipackages
  if (!this->packageFileNames.empty()) {
    ifwCmd.emplace_back(this->packageFileNames[0]);
  } else {
    ifwCmd.emplace_back("installer" + this->OutputExtension);
  }

  return ifwCmd;
}